

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

bool __thiscall r_exec::SRMonitor::reduce(SRMonitor *this,_Fact *input)

{
  bool success;
  short sVar1;
  int iVar2;
  int iVar3;
  Pred *this_00;
  _Fact *this_01;
  Sim *sim;
  undefined4 extraout_var;
  _Fact *this_02;
  Goal *affected_goal;
  long *plVar4;
  
  iVar2 = (*((this->super_SGMonitor).super__GMonitor.super_Monitor.target.object)->_vptr__Object
            [0xe])();
  if (SUB41(iVar2,0) == false) {
    this_00 = _Fact::get_pred(input);
    if (this_00 != (Pred *)0x0) {
      this_01 = Pred::get_target(this_00);
      sim = Pred::get_simulation
                      (this_00,(Controller *)
                               (this->super_SGMonitor).super__GMonitor.super_Monitor.target.object);
      if (sim != (Sim *)0x0) {
        iVar3 = (*(this_01->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(this_01,0);
        plVar4 = (long *)CONCAT44(extraout_var,iVar3);
        (**(code **)(*plVar4 + 0x20))(plVar4,0);
        sVar1 = r_code::Atom::asOpcode();
        if (sVar1 == Opcodes::Success) {
          this_02 = (_Fact *)(**(code **)(*plVar4 + 0x48))(plVar4,1);
          affected_goal = _Fact::get_goal(this_02);
          if (affected_goal != (Goal *)0x0) {
            success = _Fact::is_fact(this_01);
            _GMonitor::store_simulated_outcome((_GMonitor *)this,affected_goal,sim,success);
          }
        }
      }
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool SRMonitor::reduce(_Fact *input)
{
    if (target->is_invalidated()) {
        return true;
    }

    Pred *prediction = input->get_pred();

    if (prediction) { // input is f0->pred->f1->object.
        _Fact *_input = prediction->get_target(); // _input is f1->obj.
        Sim *sim = prediction->get_simulation(target);

        if (sim) {
            Code *outcome = _input->get_reference(0);

            if (outcome->code(0).asOpcode() == Opcodes::Success) { // _input is f1->success or |f1->success.
                _Fact *f_success = (_Fact *)outcome->get_reference(SUCCESS_OBJ);
                Goal *affected_goal = f_success->get_goal();

                if (affected_goal) {
                    store_simulated_outcome(affected_goal, sim, _input->is_fact());
                    return false;
                }
            }
        }
    }

    return false;
}